

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall google::protobuf::TextFormat::Printer::TextGenerator::Outdent(TextGenerator *this)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_55 [13];
  LogMessage local_48;
  TextGenerator *local_10;
  TextGenerator *this_local;
  
  local_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) &&
     (uVar1 = std::__cxx11::string::size(), (ulong)(long)(this->initial_indent_level_ << 1) <= uVar1
     )) {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)&this->indent_);
    return;
  }
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/text_format.cc"
             ,0x3b3);
  other = internal::LogMessage::operator<<(&local_48," Outdent() without matching Indent().");
  internal::LogFinisher::operator=(local_55,other);
  internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void Outdent() {
    if (indent_.empty() ||
        indent_.size() < initial_indent_level_ * 2) {
      GOOGLE_LOG(DFATAL) << " Outdent() without matching Indent().";
      return;
    }

    indent_.resize(indent_.size() - 2);
  }